

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O2

void LowerBinaryOperationIntoBlock
               (ExpressionContext *ctx,RegVmLoweredFunction *lowFunction,RegVmLoweredBlock *lowBlock
               ,VmInstruction *inst,uchar lhsReg,RegVmInstructionCode iCode,
               RegVmInstructionCode dCode,RegVmInstructionCode lCode)

{
  SmallArray<VmValue_*,_4U> *this;
  VmValueType VVar1;
  uchar rA;
  byte bVar2;
  uint uVar3;
  VmValue **ppVVar4;
  SynBase *location;
  uchar rC;
  
  this = &inst->arguments;
  ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](this,0);
  VVar1 = ((*ppVVar4)->type).type;
  ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](this,1);
  uVar3 = TryLowerConstantToMemory(lowBlock,*ppVVar4);
  if (uVar3 == 0) {
    ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](this,1);
    bVar2 = GetArgumentRegister(ctx,lowFunction,lowBlock,*ppVVar4);
    rA = RegVmLoweredFunction::AllocateRegister(lowFunction,&inst->super_VmValue,0,true);
    if (VVar1 == VM_TYPE_INT) {
      location = (inst->super_VmValue).source;
      uVar3 = (uint)bVar2 << 3;
    }
    else if ((dCode == rviNop) || (VVar1 != VM_TYPE_DOUBLE)) {
      if ((VVar1 != VM_TYPE_POINTER) && (VVar1 != VM_TYPE_LONG)) {
        __assert_fail("!\"unknown type\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                      ,0x2a9,
                      "void LowerBinaryOperationIntoBlock(ExpressionContext &, RegVmLoweredFunction *, RegVmLoweredBlock *, VmInstruction *, unsigned char, RegVmInstructionCode, RegVmInstructionCode, RegVmInstructionCode)"
                     );
      }
      location = (inst->super_VmValue).source;
      uVar3 = (uint)bVar2 << 3;
      iCode = lCode;
    }
    else {
      location = (inst->super_VmValue).source;
      uVar3 = (uint)bVar2 << 3;
      iCode = dCode;
    }
    rC = '\x03';
  }
  else {
    rA = RegVmLoweredFunction::AllocateRegister(lowFunction,&inst->super_VmValue,0,true);
    if (VVar1 == VM_TYPE_INT) {
      location = (inst->super_VmValue).source;
      uVar3 = uVar3 * 4 - 4;
    }
    else if ((dCode == rviNop) || (VVar1 != VM_TYPE_DOUBLE)) {
      if ((VVar1 != VM_TYPE_POINTER) && (VVar1 != VM_TYPE_LONG)) {
        __assert_fail("!\"unknown type\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                      ,0x29b,
                      "void LowerBinaryOperationIntoBlock(ExpressionContext &, RegVmLoweredFunction *, RegVmLoweredBlock *, VmInstruction *, unsigned char, RegVmInstructionCode, RegVmInstructionCode, RegVmInstructionCode)"
                     );
      }
      location = (inst->super_VmValue).source;
      uVar3 = uVar3 * 4 - 4;
      iCode = lCode;
    }
    else {
      location = (inst->super_VmValue).source;
      uVar3 = uVar3 * 4 - 4;
      iCode = dCode;
    }
    rC = '\x02';
  }
  RegVmLoweredBlock::AddInstruction(lowBlock,ctx,location,iCode,rA,lhsReg,rC,uVar3);
  return;
}

Assistant:

void LowerBinaryOperationIntoBlock(ExpressionContext &ctx, RegVmLoweredFunction *lowFunction, RegVmLoweredBlock *lowBlock, VmInstruction *inst, unsigned char lhsReg, RegVmInstructionCode iCode, RegVmInstructionCode dCode, RegVmInstructionCode lCode)
{
	VmValueType lhsType = inst->arguments[0]->type.type;

	if(unsigned constantIndex = TryLowerConstantToMemory(lowBlock, inst->arguments[1]))
	{
		unsigned char targetReg = lowFunction->AllocateRegister(inst);

		if(lhsType == VM_TYPE_INT || (lhsType == VM_TYPE_POINTER && NULLC_PTR_SIZE == 4))
			lowBlock->AddInstruction(ctx, inst->source, iCode, targetReg, lhsReg, rvrrConstants, (constantIndex - 1) * sizeof(unsigned));
		else if(lhsType == VM_TYPE_DOUBLE && dCode != rviNop)
			lowBlock->AddInstruction(ctx, inst->source, dCode, targetReg, lhsReg, rvrrConstants, (constantIndex - 1) * sizeof(unsigned));
		else if(lhsType == VM_TYPE_LONG || (lhsType == VM_TYPE_POINTER && NULLC_PTR_SIZE == 8))
			lowBlock->AddInstruction(ctx, inst->source, lCode, targetReg, lhsReg, rvrrConstants, (constantIndex - 1) * sizeof(unsigned));
		else
			assert(!"unknown type");
	}
	else
	{
		unsigned char rhsReg = GetArgumentRegister(ctx, lowFunction, lowBlock, inst->arguments[1]);
		unsigned char targetReg = lowFunction->AllocateRegister(inst);

		if(lhsType == VM_TYPE_INT || (lhsType == VM_TYPE_POINTER && NULLC_PTR_SIZE == 4))
			lowBlock->AddInstruction(ctx, inst->source, iCode, targetReg, lhsReg, rvrrRegisters, rhsReg * sizeof(RegVmRegister));
		else if(lhsType == VM_TYPE_DOUBLE && dCode != rviNop)
			lowBlock->AddInstruction(ctx, inst->source, dCode, targetReg, lhsReg, rvrrRegisters, rhsReg * sizeof(RegVmRegister));
		else if(lhsType == VM_TYPE_LONG || (lhsType == VM_TYPE_POINTER && NULLC_PTR_SIZE == 8))
			lowBlock->AddInstruction(ctx, inst->source, lCode, targetReg, lhsReg, rvrrRegisters, rhsReg * sizeof(RegVmRegister));
		else
			assert(!"unknown type");
	}
}